

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O1

void soplex::
     LPFwriteRow<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
               (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *p_lp,ostream *p_output,NameSet *p_cnames,
               SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *p_svec,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *p_lhs,
               number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *p_rhs)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  long in_FS_OFFSET;
  cpp_dec_float<200U,_int,_void> local_98;
  
  LPFwriteSVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
            (p_lp,p_output,p_cnames,p_svec,false);
  if ((((p_lhs->m_backend).fpclass == cpp_dec_float_NaN) ||
      ((p_rhs->m_backend).fpclass == cpp_dec_float_NaN)) ||
     (iVar1 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                        (&p_lhs->m_backend,&p_rhs->m_backend), iVar1 != 0)) {
    ::soplex::infinity::__tls_init();
    local_98.fpclass = cpp_dec_float_finite;
    local_98.prec_elem = 0x1c;
    local_98.data._M_elems[0] = 0;
    local_98.data._M_elems[1] = 0;
    local_98.data._M_elems[2] = 0;
    local_98.data._M_elems[3] = 0;
    local_98.data._M_elems[4] = 0;
    local_98.data._M_elems[5] = 0;
    local_98.data._M_elems[6] = 0;
    local_98.data._M_elems[7] = 0;
    local_98.data._M_elems[8] = 0;
    local_98.data._M_elems[9] = 0;
    local_98.data._M_elems[10] = 0;
    local_98.data._M_elems[0xb] = 0;
    local_98.data._M_elems[0xc] = 0;
    local_98.data._M_elems[0xd] = 0;
    local_98.data._M_elems[0xe] = 0;
    local_98.data._M_elems[0xf] = 0;
    local_98.data._M_elems[0x10] = 0;
    local_98.data._M_elems[0x11] = 0;
    local_98.data._M_elems[0x12] = 0;
    local_98.data._M_elems[0x13] = 0;
    local_98.data._M_elems[0x14] = 0;
    local_98.data._M_elems[0x15] = 0;
    local_98.data._M_elems[0x16] = 0;
    local_98.data._M_elems[0x17] = 0;
    local_98.data._M_elems[0x18] = 0;
    local_98.data._M_elems[0x19] = 0;
    local_98.data._M_elems._104_5_ = 0;
    local_98.data._M_elems[0x1b]._1_3_ = 0;
    local_98.exp = 0;
    local_98.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_98,-*(double *)(in_FS_OFFSET + -8));
    if ((((p_lhs->m_backend).fpclass == cpp_dec_float_NaN) ||
        (local_98.fpclass == cpp_dec_float_NaN)) ||
       (iVar1 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          (&p_lhs->m_backend,&local_98), 0 < iVar1)) {
      std::__ostream_insert<char,std::char_traits<char>>(p_output," >= ",4);
      goto LAB_00149682;
    }
    pcVar3 = " <= ";
    lVar2 = 4;
  }
  else {
    pcVar3 = " = ";
    lVar2 = 3;
  }
  std::__ostream_insert<char,std::char_traits<char>>(p_output,pcVar3,lVar2);
  p_lhs = p_rhs;
LAB_00149682:
  boost::multiprecision::operator<<(p_output,p_lhs);
  std::__ostream_insert<char,std::char_traits<char>>(p_output,"\n",1);
  return;
}

Assistant:

static void LPFwriteRow(
   const SPxLPBase<R>&   p_lp,       ///< the LP
   std::ostream&         p_output,   ///< output stream
   const NameSet*        p_cnames,   ///< column names
   const SVectorBase<R>& p_svec,     ///< vector of the row
   const R&              p_lhs,      ///< lhs of the row
   const R&              p_rhs       ///< rhs of the row
)
{

   LPFwriteSVector(p_lp, p_output, p_cnames, p_svec);

   if(p_lhs == p_rhs)
      p_output << " = " << p_rhs;
   else if(p_lhs <= R(-infinity))
      p_output << " <= " << p_rhs;
   else
   {
      assert(p_rhs >= R(infinity));
      p_output << " >= " << p_lhs;
   }

   p_output << "\n";
}